

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void runCommand(string *strCommand)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *__command;
  long in_FS_OFFSET;
  LogFlags unaff_retaddr;
  int in_stack_0000000c;
  ConstevalFormatString<2U> in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  int nErr;
  undefined1 in_stack_00000060 [16];
  Level in_stack_00000140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000150;
  int *in_stack_00000158;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (!bVar2) {
    __command = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar3 = system(__command);
    if (iVar3 != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      LogPrintFormatInternal<std::__cxx11::string,int>
                ((string_view)in_stack_00000060,(string_view)in_stack_00000050,in_stack_0000000c,
                 unaff_retaddr,in_stack_00000140,in_stack_00000048,in_stack_00000150,
                 in_stack_00000158);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void runCommand(const std::string& strCommand)
{
    if (strCommand.empty()) return;
#ifndef WIN32
    int nErr = ::system(strCommand.c_str());
#else
    int nErr = ::_wsystem(std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>,wchar_t>().from_bytes(strCommand).c_str());
#endif
    if (nErr)
        LogPrintf("runCommand error: system(%s) returned %d\n", strCommand, nErr);
}